

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

void helicsDataBufferToString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  byte *data_00;
  int *piVar1;
  char *__src;
  int *in_RCX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int length;
  string v;
  SmallBuffer *ptr;
  string *in_stack_00000120;
  DataType in_stack_0000012c;
  data_view *in_stack_00000130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  HelicsDataBuffer in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SmallBuffer *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  SmallBuffer *local_28;
  int *local_20;
  int local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  if ((in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (in_EDX < 1)) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
  }
  else {
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_28 = getBuffer(in_stack_ffffffffffffff68);
    if (local_28 == (SmallBuffer *)0x0) {
      if (local_20 != (int *)0x0) {
        *local_20 = 0;
      }
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      helics::data_view::data_view
                ((data_view *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      data_00 = helics::SmallBuffer::data(local_28);
      helics::detail::detectType(data_00);
      helics::valueExtract(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
      helics::data_view::~data_view((data_view *)0x1f4876);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&local_48);
      piVar1 = std::min<int>((int *)&stack0xffffffffffffff84,&local_14);
      local_78 = *piVar1;
      this = local_10;
      __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1f48bf);
      memcpy(this,__src,(long)local_78);
      if (local_14 <= local_78) {
        local_78 = local_78 + -1;
      }
      *(undefined1 *)((long)&(local_10->_M_dataplus)._M_p + (long)local_78) = 0;
      if (local_20 != (int *)0x0) {
        *local_20 = local_78;
      }
      std::__cxx11::string::~string(this);
    }
  }
  return;
}

Assistant:

void helicsDataBufferToString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    std::memcpy(outputString, v.data(), length);

    // add a null terminator
    if (length >= maxStringLen) {
        --length;
    }
    outputString[length] = '\0';
    if (actualLength != nullptr) {
        *actualLength = length;
    }
}